

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

char * logging_get_names(void)

{
  iterator __dest;
  bool bVar1;
  file_data *pfVar2;
  size_t sVar3;
  undefined1 *puVar4;
  undefined1 local_50 [16];
  iterator i_1;
  undefined1 local_30 [16];
  iterator i;
  char *temp;
  char *pcStack_10;
  uint32_t size;
  
  temp._4_4_ = 1;
  if (jh_log_names_buffer == (char *)0x0) {
    JetHead::list<file_data>::begin((list<file_data> *)(local_30 + 8));
    while( true ) {
      JetHead::list<file_data>::end((list<file_data> *)local_30);
      bVar1 = JetHead::list<file_data>::iterator::operator!=
                        ((iterator *)(local_30 + 8),(iterator *)local_30);
      JetHead::list<file_data>::iterator::~iterator((iterator *)local_30);
      if (!bVar1) break;
      pfVar2 = JetHead::list<file_data>::iterator::operator->((iterator *)(local_30 + 8));
      sVar3 = strlen(pfVar2->filename);
      temp._4_4_ = temp._4_4_ + (int)sVar3 + 1;
      JetHead::list<file_data>::iterator::operator++((iterator *)(local_30 + 8));
    }
    JetHead::list<file_data>::iterator::~iterator((iterator *)(local_30 + 8));
    if (temp._4_4_ == 1) {
      pcStack_10 = (char *)0x0;
    }
    else {
      jh_log_names_buffer = (char *)malloc((ulong)temp._4_4_);
      i.mNode = (Node *)jh_log_names_buffer;
      JetHead::list<file_data>::begin((list<file_data> *)(local_50 + 8));
      while( true ) {
        JetHead::list<file_data>::end((list<file_data> *)local_50);
        bVar1 = JetHead::list<file_data>::iterator::operator!=
                          ((iterator *)(local_50 + 8),(iterator *)local_50);
        JetHead::list<file_data>::iterator::~iterator((iterator *)local_50);
        __dest = i;
        if (!bVar1) break;
        pfVar2 = JetHead::list<file_data>::iterator::operator->((iterator *)(local_50 + 8));
        strcpy((char *)__dest.mNode,pfVar2->filename);
        pfVar2 = JetHead::list<file_data>::iterator::operator->((iterator *)(local_50 + 8));
        sVar3 = strlen(pfVar2->filename);
        puVar4 = (undefined1 *)((long)&((i.mNode)->val).filename + sVar3);
        *puVar4 = 0x20;
        i.mNode = (Node *)(puVar4 + 1);
        JetHead::list<file_data>::iterator::operator++((iterator *)(local_50 + 8));
      }
      JetHead::list<file_data>::iterator::~iterator((iterator *)(local_50 + 8));
      *(undefined1 *)((long)&i.mNode[-1].prev + 7) = 0;
      pcStack_10 = jh_log_names_buffer;
    }
  }
  else {
    pcStack_10 = jh_log_names_buffer;
  }
  return pcStack_10;
}

Assistant:

const char* logging_get_names()
{
	uint32_t size = 1;
	char* temp;

	TRACE_BEGIN(LOG_LVL_INFO);
	
	if ( jh_log_names_buffer != NULL )
		return jh_log_names_buffer;
	
	// else figure out size, make buffer and copy data into it.

	LOG( "calculating storage size" );
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		size += strlen(i->filename) + 1;
	}

	// if no file in list yet.
	if (size == 1) 
		return NULL;

	jh_log_names_buffer = (char*)LOGGING_MALLOC( size );	
	temp = jh_log_names_buffer;

	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		strcpy( temp, i->filename );
		temp += strlen( i->filename );
		*temp = ' ';
		temp++;
	}

	temp--;
	*temp = '\0';

	return jh_log_names_buffer;
}